

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O0

base_learner * classweight_setup(options_i *options,vw *all)

{
  byte bVar1;
  bool bVar2;
  ostream *this;
  size_type sVar3;
  base_learner *this_00;
  string *pmessage;
  undefined8 uVar4;
  long in_RSI;
  long *in_RDI;
  stringstream __msg;
  string *in_stack_00000158;
  classweights *in_stack_00000160;
  learner<CLASSWEIGHTS::classweights,_example> *ret;
  single_learner *base;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  option_group_definition new_options;
  free_ptr<CLASSWEIGHTS::classweights> cweights;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classweight_array;
  string *in_stack_fffffffffffffbd8;
  vw *in_stack_fffffffffffffbe0;
  string *in_stack_fffffffffffffbe8;
  learner<CLASSWEIGHTS::classweights,_example> *in_stack_fffffffffffffbf0;
  int plineNumber;
  ostream *in_stack_fffffffffffffc08;
  vw_exception *in_stack_fffffffffffffc10;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc28;
  option_group_definition *in_stack_fffffffffffffc30;
  allocator *paVar5;
  stringstream local_380 [16];
  ostream local_370;
  learner<char,_char> *in_stack_fffffffffffffda0;
  learner<CLASSWEIGHTS::classweights,_example> *local_1f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  undefined1 *local_1d0;
  undefined4 local_1c8;
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [199];
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [88];
  undefined1 local_30 [24];
  long local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x32c304);
  scoped_calloc_or_throw<CLASSWEIGHTS::classweights>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"importance weight classes",&local_a9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"classweight",&local_171);
  VW::config::make_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffbe8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"importance weight multiplier for class",&local_199);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::help((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffbe0);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  (**(code **)*local_10)(local_10,local_88);
  paVar5 = &local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"classweight",paVar5);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    local_1d0 = local_30;
    local_1d8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffbd8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_stack_fffffffffffffbd8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffbe0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffbd8);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_1d8);
      std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::operator->
                ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)0x32c6ef);
      CLASSWEIGHTS::classweights::load_string(in_stack_00000160,in_stack_00000158);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1d8);
    }
    if ((*(byte *)(local_18 + 0x3439) & 1) == 0) {
      this = std::operator<<((ostream *)(local_18 + 0xe0),"parsed ");
      std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::operator->
                ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)0x32c752);
      sVar3 = std::
              unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
              ::size((unordered_map<unsigned_int,_float,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                      *)0x32c75a);
      in_stack_fffffffffffffc10 = (vw_exception *)std::ostream::operator<<(this,sVar3);
      in_stack_fffffffffffffc08 =
           std::operator<<((ostream *)in_stack_fffffffffffffc10," class weights");
      std::ostream::operator<<(in_stack_fffffffffffffc08,std::endl<char,std::char_traits<char>>);
    }
    this_00 = setup_base((options_i *)in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0);
    pmessage = (string *)LEARNER::as_singleline<char,char>(in_stack_fffffffffffffda0);
    if (*(int *)&pmessage[6].field_2 == 0) {
      in_stack_fffffffffffffbf0 =
           LEARNER::init_learner<CLASSWEIGHTS::classweights,example,LEARNER::learner<char,example>>
                     ((free_ptr<CLASSWEIGHTS::classweights> *)in_stack_fffffffffffffbf0,
                      (learner<char,_example> *)in_stack_fffffffffffffbe8,
                      (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffbe0,
                      (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                      in_stack_fffffffffffffbd8);
      local_1f8 = in_stack_fffffffffffffbf0;
    }
    else {
      if (*(int *)&pmessage[6].field_2 != 4) {
        std::__cxx11::stringstream::stringstream(local_380);
        plineNumber = (int)((ulong)this_00 >> 0x20);
        std::operator<<(&local_370,"--classweight not implemented for this type of prediction");
        uVar4 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,plineNumber,pmessage)
        ;
        __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      local_1f8 = LEARNER::
                  init_learner<CLASSWEIGHTS::classweights,example,LEARNER::learner<char,example>>
                            ((free_ptr<CLASSWEIGHTS::classweights> *)in_stack_fffffffffffffbf0,
                             (learner<char,_example> *)in_stack_fffffffffffffbe8,
                             (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffffbe0,
                             (_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *)
                             in_stack_fffffffffffffbd8);
    }
    LEARNER::learner<CLASSWEIGHTS::classweights,_example>::set_finish
              ((learner<CLASSWEIGHTS::classweights,_example> *)this_00,
               (_func_void_classweights_ptr *)pmessage);
    local_8 = LEARNER::make_base<CLASSWEIGHTS::classweights,example>(local_1f8);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_1c8 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffbe0);
  std::unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CLASSWEIGHTS::classweights,_void_(*)(void_*)> *)in_stack_fffffffffffffbf0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbf0);
  return local_8;
}

Assistant:

LEARNER::base_learner* classweight_setup(options_i& options, vw& all)
{
  vector<string> classweight_array;
  auto cweights = scoped_calloc_or_throw<classweights>();
  option_group_definition new_options("importance weight classes");
  new_options.add(make_option("classweight", classweight_array).help("importance weight multiplier for class"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("classweight"))
    return nullptr;

  for (auto& s : classweight_array) cweights->load_string(s);

  if (!all.quiet)
    all.trace_message << "parsed " << cweights->weights.size() << " class weights" << endl;

  LEARNER::single_learner* base = as_singleline(setup_base(options, all));

  LEARNER::learner<classweights, example>* ret;
  if (base->pred_type == prediction_type::scalar)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::scalar>,
        predict_or_learn<false, prediction_type::scalar>);
  else if (base->pred_type == prediction_type::multiclass)
    ret = &LEARNER::init_learner<classweights>(cweights, base, predict_or_learn<true, prediction_type::multiclass>,
        predict_or_learn<false, prediction_type::multiclass>);
  else
    THROW("--classweight not implemented for this type of prediction");
  ret->set_finish(finish);
  return make_base(*ret);
}